

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O2

bool __thiscall Minefield::isGameWon(Minefield *this)

{
  bool bVar1;
  long lVar2;
  int y;
  size_type __n;
  reference rVar3;
  
  bVar1 = isGameEnded(this);
  if (bVar1) {
    for (lVar2 = 0; lVar2 < this->given_x_dimension; lVar2 = lVar2 + 1) {
      for (__n = 0; (long)__n < (long)this->given_y_dimension; __n = __n + 1) {
        bVar1 = isOpen(this,(int)lVar2,(int)__n);
        if (!bVar1) {
          rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((this->mines).
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2,__n);
          if ((*rVar3._M_p & rVar3._M_mask) == 0) goto LAB_0010e449;
        }
      }
    }
    bVar1 = true;
  }
  else {
LAB_0010e449:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Minefield::isGameWon() {
    if (! isGameEnded()) {
        return false;
    }

    // all fields w/o mines are opened
    // -> no field opened w/o mine
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if ((! isOpen(x, y)) && (! mines[x][y])) {
                // field w/o mine has not been opened
                return false;
            }
        }
    }

    // all fields w/o mines are opened
    return true;
}